

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_appendAString_failure_nullptrDestArray_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString srcString;
  
  srcString.reallocator._0_4_ = 0x11e238;
  srcString.reallocator._4_4_ = 0;
  srcString.deallocator._0_4_ = 0x11e278;
  srcString.deallocator._4_4_ = 0;
  srcString.buffer = (char *)0x0;
  srcString.size = 3;
  srcString.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x12d8d1;
  srcString.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(srcString.buffer,"012",4);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x12d901;
  bVar1 = AString_appendAString((AString *)0x0,&srcString);
  if (bVar1 != false) {
    uStack_50 = 0x12d9fa;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x445,"Assertion \'!AString_appendAString(((void*)0), &srcString)\' failed",0
                      ,0);
  }
  uStack_50 = 0x12d91a;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x445);
  if (srcString.capacity == 8) {
    uStack_50 = 0x12d93a;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x446);
    if (srcString.buffer == (char *)0x0) {
      ppcVar7 = &local_58;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (srcString).buffer != NULL";
      pcVar9 = "(void*) (srcString).buffer";
      iVar2 = 0x446;
LAB_0012db53:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) = test_AString_get_indexInBounds_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_50 = 0x12d957;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x446);
    pcVar9 = srcString.buffer;
    if (srcString.buffer == (char *)0x0) {
      pcVar4 = "";
      pcVar9 = "(null)";
    }
    else {
      uStack_50 = 0x12d974;
      iVar2 = strcmp("012",srcString.buffer);
      if (iVar2 == 0) {
        uStack_50 = 0x12d98d;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x446);
        if (srcString.size == 3) {
          uStack_50 = 0x12d9ad;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x446);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            uStack_50 = 0x12d9ce;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x447);
            uStack_50 = 0x12d9d7;
            (*(code *)CONCAT44(srcString.deallocator._4_4_,srcString.deallocator._0_4_))
                      (srcString.buffer);
            return;
          }
          ppcVar7 = &local_68;
          local_60 = "(0)";
          local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar9 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x447;
          goto LAB_0012db53;
        }
        local_60 = "strlen(\"012\")";
        pcVar5 = "(srcString).size == strlen(\"012\")";
        pcVar8 = "(srcString).size";
        local_58 = (char *)0x3;
        pcVar4 = (char *)srcString.size;
        goto LAB_0012db06;
      }
      pcVar4 = "\"";
    }
    expr = 
    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
    ;
    pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
    pcVar5 = "(srcString).buffer == (\"012\")";
    pcVar8 = "(srcString).buffer";
    local_58 = "\"";
    local_60 = "012";
    local_68 = "\"";
    pcStack_70 = "(\"012\")";
    ppcVar6 = &pcStack_80;
    pcStack_80 = pcVar9;
    pcStack_78 = pcVar4;
  }
  else {
    local_60 = "(8)";
    pcVar5 = "(srcString).capacity == (8)";
    pcVar8 = "(srcString).capacity";
    local_58 = (char *)0x8;
    pcVar4 = (char *)srcString.capacity;
LAB_0012db06:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &local_60;
  }
  uStack_50 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar4;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x12db0f;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x446,expr,pcVar3,pcVar5,pcVar8);
}

Assistant:

END_TEST
START_TEST(test_AString_appendAString_failure_nullptrDestArray)
{
    struct AString srcString = private_ACUtilsTest_AString_constructTestString("012", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(!AString_appendAString(nullptr, &srcString));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(srcString, "012", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(srcString);
}